

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_equal_rnd(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  char *in_RCX;
  vm_val_t *in_RDX;
  uint *in_RDI;
  int ret;
  vm_val_t val2;
  vm_val_t *in_stack_ffffffffffffffa8;
  vm_obj_id_t self_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffd0;
  
  if ((getp_equal_rnd(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_equal_rnd(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_equal_rnd::desc,1);
    __cxa_guard_release(&getp_equal_rnd(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_RDI,(CVmNativeCodeDesc *)in_stack_ffffffffffffffa8);
  self_00 = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
  if (iVar1 == 0) {
    CVmStack::pop((vm_val_t *)&stack0xffffffffffffffc8);
    iVar1 = cvt_to_bignum((CVmObjBigNum *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),self_00,
                          in_stack_ffffffffffffffa8);
    if (iVar1 == 0) {
      vm_val_t::set_nil(in_RDX);
    }
    else {
      get_objid_ext(0);
      iVar1 = compute_eq_round(in_RCX,(char *)in_stack_ffffffffffffffd0.ptr);
      vm_val_t::set_logical(in_RDX,iVar1);
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_equal_rnd(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the value to compare */
    G_stk->pop(&val2);

    /* convert it to BigNumber */
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* it's not a BigNumber, so it's not equal */
        retval->set_nil();
    }
    else
    {
        int ret;
        
        /* test for equality */
        ret = compute_eq_round(vmg_ ext_, get_objid_ext(vmg_ val2.val.obj));

        /* set the return value */
        retval->set_logical(ret);
    }

    /* handled */
    return TRUE;
}